

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O0

void test_insert(void)

{
  json *this;
  ostream *this_00;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> local_228;
  allocator local_219;
  string local_218 [32];
  unique_ptr<argo::json,_std::default_delete<argo::json>_> local_1f8;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> x;
  allocator local_191;
  string local_190 [32];
  json local_170;
  allocator local_111;
  string local_110 [32];
  json local_f0;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  json o;
  
  argo::json::json((json *)local_60,object_e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"one",&local_81);
  argo::json::json(&local_f0,1);
  argo::json::insert((json *)local_60,(string *)local_80,&local_f0);
  argo::json::~json(&local_f0);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"two",&local_111);
  argo::json::json(&local_170,2.123);
  argo::json::insert((json *)local_60,(string *)local_110,&local_170);
  argo::json::~json(&local_170);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"three",&local_191);
  argo::json::json((json *)&x,"asfdsad");
  argo::json::insert((json *)local_60,(string *)local_190,(json *)&x);
  argo::json::~json((json *)&x);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  this = (json *)operator_new(0x58);
  argo::json::json(this,1.23);
  std::unique_ptr<argo::json,std::default_delete<argo::json>>::
  unique_ptr<std::default_delete<argo::json>,void>
            ((unique_ptr<argo::json,std::default_delete<argo::json>> *)&local_1f8,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"four",&local_219);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::unique_ptr(&local_228,&local_1f8);
  argo::json::insert((json *)local_60,(string *)local_218,&local_228);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr(&local_228);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  this_00 = argo::operator<<((ostream *)jlog,(json *)local_60);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr(&local_1f8);
  argo::json::~json((json *)local_60);
  return;
}

Assistant:

void test_insert()
{
    json o(json::object_e);

    o.insert("one", 1);
    o.insert("two", 2.123);
    o.insert("three", "asfdsad");
    unique_ptr<json> x(new json(1.23));
    o.insert("four", move(x));

    jlog << o << endl;
}